

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# toml.h
# Opt level: O2

Token * __thiscall toml::internal::Lexer::nextValue(Token *__return_storage_ptr__,Lexer *this)

{
  bool bVar1;
  int iVar2;
  char c;
  allocator local_1f1;
  int64_t x;
  string s;
  stringstream ss;
  
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  bVar1 = current(this,&c);
  if (bVar1) {
    iVar2 = isalpha((int)c);
    if (iVar2 != 0) {
      std::__cxx11::string::push_back((char)&s);
      next(this);
      while( true ) {
        bVar1 = current(this,&c);
        if (!bVar1) break;
        iVar2 = isalpha((int)c);
        if (iVar2 == 0) break;
        std::__cxx11::string::push_back((char)&s);
        next(this);
      }
      bVar1 = std::operator==(&s,"true");
      if (bVar1) {
        __return_storage_ptr__->type_ = BOOL;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        (__return_storage_ptr__->str_value_)._M_string_length = 0;
        (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->int_value_ = 1;
      }
      else {
        bVar1 = std::operator==(&s,"false");
        if (!bVar1) {
          std::__cxx11::string::string((string *)&x,"Unknown ident: ",&local_1f1);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ss,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&x,&s)
          ;
          Token::Token(__return_storage_ptr__,ERROR_TOKEN,(string *)&ss);
          std::__cxx11::string::~string((string *)&ss);
          std::__cxx11::string::~string((string *)&x);
          goto LAB_0016a3a1;
        }
        __return_storage_ptr__->type_ = BOOL;
        (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->str_value_).field_2;
        (__return_storage_ptr__->str_value_)._M_string_length = 0;
        (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
        __return_storage_ptr__->int_value_ = 0;
      }
      (__return_storage_ptr__->time_value_).__d.__r = 0;
      goto LAB_0016a3a1;
    }
  }
  while( true ) {
    bVar1 = current(this,&c);
    if ((!bVar1) ||
       ((9 < (byte)(c - 0x30U) &&
        ((0x3a < (byte)c - 0x2b ||
         ((0x41082000400800dU >> ((ulong)((byte)c - 0x2b) & 0x3f) & 1) == 0)))))) break;
    next(this);
    std::__cxx11::string::push_back((char)&s);
  }
  bVar1 = isInteger(&s);
  if (bVar1) {
    removeDelimiter((string *)&x,&s);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&x,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&x);
    std::istream::_M_extract<long>((long *)&ss);
    __return_storage_ptr__->type_ = INT;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    (__return_storage_ptr__->str_value_)._M_string_length = 0;
    (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->int_value_ = x;
  }
  else {
    bVar1 = isDouble(&s);
    if (!bVar1) {
      parseAsTime(__return_storage_ptr__,this,&s);
      goto LAB_0016a3a1;
    }
    removeDelimiter((string *)&x,&s);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&x,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&x);
    std::istream::_M_extract<double>((double *)&ss);
    __return_storage_ptr__->type_ = DOUBLE;
    (__return_storage_ptr__->str_value_)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->str_value_).field_2;
    (__return_storage_ptr__->str_value_)._M_string_length = 0;
    (__return_storage_ptr__->str_value_).field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__->double_value_ = (double)x;
  }
  (__return_storage_ptr__->time_value_).__d.__r = 0;
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
LAB_0016a3a1:
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

inline Token Lexer::nextValue()
{
    std::string s;
    char c;

    if (current(&c) && isalpha(c)) {
        s += c;
        next();
        while (current(&c) && isalpha(c)) {
            s += c;
            next();
        }

        if (s == "true")
            return Token(TokenType::BOOL, true);
        if (s == "false")
            return Token(TokenType::BOOL, false);
        return Token(TokenType::ERROR_TOKEN, std::string("Unknown ident: ") + s);
    }

    while (current(&c) && (('0' <= c && c <= '9') || c == '.' || c == 'e' || c == 'E' ||
                           c == 'T' || c == 'Z' || c == '_' || c == ':' || c == '-' || c == '+')) {
        next();
        s += c;
    }

    if (isInteger(s)) {
        std::stringstream ss(removeDelimiter(s));
        std::int64_t x;
        ss >> x;
        return Token(TokenType::INT, x);
    }

    if (isDouble(s)) {
        std::stringstream ss(removeDelimiter(s));
        double d;
        ss >> d;
        return Token(TokenType::DOUBLE, d);
    }

    return parseAsTime(s);
}